

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509write_csr.c
# Opt level: O0

int mbedtls_x509write_csr_pem
              (mbedtls_x509write_csr *ctx,uchar *buf,size_t size,
              _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  size_t local_1050;
  size_t olen;
  uchar output_buf [4096];
  int ret;
  void *p_rng_local;
  _func_int_void_ptr_uchar_ptr_size_t *f_rng_local;
  size_t size_local;
  uchar *buf_local;
  mbedtls_x509write_csr *ctx_local;
  
  local_1050 = 0;
  ctx_local._4_4_ = mbedtls_x509write_csr_der(ctx,(uchar *)&olen,0x1000,f_rng,p_rng);
  if ((-1 < ctx_local._4_4_) &&
     (ctx_local._4_4_ =
           mbedtls_pem_write_buffer
                     ("-----BEGIN CERTIFICATE REQUEST-----\n","-----END CERTIFICATE REQUEST-----\n",
                      output_buf + (0xff8 - (long)ctx_local._4_4_),(long)ctx_local._4_4_,buf,size,
                      &local_1050), ctx_local._4_4_ == 0)) {
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_x509write_csr_pem( mbedtls_x509write_csr *ctx, unsigned char *buf, size_t size,
                       int (*f_rng)(void *, unsigned char *, size_t),
                       void *p_rng )
{
    int ret;
    unsigned char output_buf[4096];
    size_t olen = 0;

    if( ( ret = mbedtls_x509write_csr_der( ctx, output_buf, sizeof(output_buf),
                                   f_rng, p_rng ) ) < 0 )
    {
        return( ret );
    }

    if( ( ret = mbedtls_pem_write_buffer( PEM_BEGIN_CSR, PEM_END_CSR,
                                  output_buf + sizeof(output_buf) - ret,
                                  ret, buf, size, &olen ) ) != 0 )
    {
        return( ret );
    }

    return( 0 );
}